

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

If_Obj_t * If_ManCreateCi(If_Man_t *p)

{
  int iVar1;
  If_Obj_t *Entry;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  Entry = If_ManSetupObj(p);
  *(uint *)Entry = *(uint *)Entry & 0xfffffff0 | 2;
  iVar1 = Vec_PtrSize(p->vCis);
  Entry->IdPio = iVar1;
  Vec_PtrPush(p->vCis,Entry);
  p->nObjs[2] = p->nObjs[2] + 1;
  return Entry;
}

Assistant:

If_Obj_t * If_ManCreateCi( If_Man_t * p )
{
    If_Obj_t * pObj;
    pObj = If_ManSetupObj( p );
    pObj->Type = IF_CI;
    pObj->IdPio = Vec_PtrSize( p->vCis );
    Vec_PtrPush( p->vCis, pObj );
    p->nObjs[IF_CI]++;
    return pObj;
}